

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::~ReflectionClassGenerator
          (ReflectionClassGenerator *this)

{
  ~ReflectionClassGenerator(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

ReflectionClassGenerator::~ReflectionClassGenerator() {
}